

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZFYsmpMatrix<long_double>::TPZMThread>::Resize
          (TPZVec<TPZFYsmpMatrix<long_double>::TPZMThread> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  void *pvVar2;
  ulong uVar3;
  ulong in_RSI;
  long in_RDI;
  int64_t i;
  int64_t large;
  TPZMThread *newstore;
  ulong local_40;
  long local_28;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    pvVar2 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      if (*(void **)(in_RDI + 8) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 8));
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar3 = SUB168(auVar1 * ZEXT816(0x50),0);
      if (SUB168(auVar1 * ZEXT816(0x50),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar2 = operator_new__(uVar3);
      local_40 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_40 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_28 = 0; local_28 < (long)local_40; local_28 = local_28 + 1) {
        memcpy((void *)((long)pvVar2 + local_28 * 0x50),
               (void *)(*(long *)(in_RDI + 8) + local_28 * 0x50),0x50);
      }
      if ((*(long *)(in_RDI + 8) != 0) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
        operator_delete__(*(void **)(in_RDI + 8));
      }
      *(void **)(in_RDI + 8) = pvVar2;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}